

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_normal.c
# Opt level: O2

void prf_obsolete_vertex_with_normal_fill_vertex(prf_node_t *node,prf_vertex_t *vertex)

{
  ulong uVar1;
  ulong *puVar2;
  undefined1 auVar3 [16];
  double dVar4;
  
  puVar2 = (ulong *)node->data;
  uVar1 = *puVar2;
  auVar3._0_8_ = uVar1 & 0xffffffff;
  auVar3._8_4_ = (int)(uVar1 >> 0x20);
  auVar3._12_4_ = 0;
  dVar4 = DAT_0010e600._8_8_;
  auVar3 = auVar3 | _DAT_0010e600;
  vertex->x = (float64_t)(auVar3._0_8_ - (double)DAT_0010e600);
  vertex->y = (float64_t)(auVar3._8_8_ - dVar4);
  vertex->z = (float64_t)(double)(uint)puVar2[1];
  return;
}

Assistant:

void
prf_obsolete_vertex_with_normal_fill_vertex(
    prf_node_t * node,
    prf_vertex_t * vertex )
{
    int pos = 4;
    bool_t complete = FALSE;

    assert( node != NULL && vertex != NULL );

    do {
        node_data * data = (node_data *) node->data;
        prf_dblwrite( vertex->x, (float64_t) data->x ); pos += 8;
        prf_dblwrite( vertex->y, (float64_t) data->y ); pos += 8;
        prf_dblwrite( vertex->z, (float64_t) data->z ); pos += 8;
        complete = TRUE;
    } while ( FALSE );

}